

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependencies.cpp
# Opt level: O0

void __thiscall
dg::llvmdg::SDGDependenciesBuilder::addControlDep
          (SDGDependenciesBuilder *this,DepDGElement *elem,Value *on)

{
  DependenceGraph *this_00;
  bool bVar1;
  ret_type pBVar2;
  DGNodeCall *this_01;
  DGParameters *this_02;
  DGNode *pDVar3;
  reference ppDVar4;
  DGFormalParameters *this_03;
  DepDGElement *in_RDI;
  DGNode *fnoret;
  DependenceGraph *calledF;
  iterator __end4;
  iterator __begin4;
  CalleesTy *__range4;
  DGNode *noret;
  DGNodeCall *C;
  DepDGElement *depnd;
  DGBBlock *depblock;
  BasicBlock *depB;
  DepDGElement *in_stack_ffffffffffffff88;
  _Self in_stack_ffffffffffffffa8;
  _Self in_stack_ffffffffffffffb0;
  
  pBVar2 = llvm::dyn_cast<llvm::BasicBlock,llvm::Value_const>((Value *)in_RDI);
  if (pBVar2 == (ret_type)0x0) {
    SystemDependenceGraph::getNode
              ((SystemDependenceGraph *)in_stack_ffffffffffffffb0._M_node,
               (Value *)in_stack_ffffffffffffffa8._M_node);
    sdg::DepDGElement::get(&in_stack_ffffffffffffff88->super_DGElement);
    this_01 = sdg::DGNodeCall::get(&in_RDI->super_DGElement);
    if (this_01 == (DGNodeCall *)0x0) {
      sdg::DepDGElement::addControlDep(in_RDI,in_stack_ffffffffffffff88);
    }
    else {
      this_02 = sdg::DGNodeCall::getParameters(this_01);
      pDVar3 = sdg::DGParameters::getNoReturn(this_02);
      if (pDVar3 == (DGNode *)0x0) {
        sdg::DGNodeCall::getParameters(this_01);
        dg::sdg::DGParameters::createNoReturn();
      }
      sdg::DepDGElement::addControlDep(in_RDI,in_stack_ffffffffffffff88);
      sdg::DGNodeCall::getCallees(this_01);
      std::
      set<dg::sdg::DependenceGraph_*,_std::less<dg::sdg::DependenceGraph_*>,_std::allocator<dg::sdg::DependenceGraph_*>_>
      ::begin((set<dg::sdg::DependenceGraph_*,_std::less<dg::sdg::DependenceGraph_*>,_std::allocator<dg::sdg::DependenceGraph_*>_>
               *)in_stack_ffffffffffffff88);
      std::
      set<dg::sdg::DependenceGraph_*,_std::less<dg::sdg::DependenceGraph_*>,_std::allocator<dg::sdg::DependenceGraph_*>_>
      ::end((set<dg::sdg::DependenceGraph_*,_std::less<dg::sdg::DependenceGraph_*>,_std::allocator<dg::sdg::DependenceGraph_*>_>
             *)in_stack_ffffffffffffff88);
      while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffb0,
                                     (_Self *)&stack0xffffffffffffffa8), bVar1) {
        ppDVar4 = std::_Rb_tree_const_iterator<dg::sdg::DependenceGraph_*>::operator*
                            ((_Rb_tree_const_iterator<dg::sdg::DependenceGraph_*> *)0x1417ba);
        this_00 = *ppDVar4;
        this_03 = sdg::DependenceGraph::getParameters(this_00);
        pDVar3 = sdg::DGParameters::getNoReturn(&this_03->super_DGParameters);
        if (pDVar3 == (DGNode *)0x0) {
          sdg::DependenceGraph::getParameters(this_00);
          dg::sdg::DGParameters::createNoReturn();
        }
        sdg::DepDGElement::addControlDep(in_RDI,in_stack_ffffffffffffff88);
        std::_Rb_tree_const_iterator<dg::sdg::DependenceGraph_*>::operator++
                  ((_Rb_tree_const_iterator<dg::sdg::DependenceGraph_*> *)in_RDI);
      }
    }
  }
  else {
    SystemDependenceGraph::getBBlock
              ((SystemDependenceGraph *)in_stack_ffffffffffffffb0._M_node,
               (BasicBlock *)in_stack_ffffffffffffffa8._M_node);
    sdg::DepDGElement::addControlDep(in_RDI,in_stack_ffffffffffffff88);
  }
  return;
}

Assistant:

void addControlDep(sdg::DepDGElement *elem, const llvm::Value *on) {
        if (const auto *depB = llvm::dyn_cast<llvm::BasicBlock>(on)) {
            auto *depblock = _sdg.getBBlock(depB);
            assert(depblock && "Do not have the block");
            elem->addControlDep(*depblock);
        } else {
            auto *depnd = sdg::DepDGElement::get(_sdg.getNode(on));
            assert(depnd && "Do not have the node");

            if (auto *C = sdg::DGNodeCall::get(depnd)) {
                // this is 'noret' dependence (we have no other control deps for
                // calls)
                auto *noret = C->getParameters().getNoReturn();
                if (!noret)
                    noret = &C->getParameters().createNoReturn();
                elem->addControlDep(*noret);

                // add CD to all formal norets
                for (auto *calledF : C->getCallees()) {
                    auto *fnoret = calledF->getParameters().getNoReturn();
                    if (!fnoret)
                        fnoret = &calledF->getParameters().createNoReturn();
                    noret->addControlDep(*fnoret);
                }
            } else {
                elem->addControlDep(*depnd);
            }
        }
    }